

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server_auth.cc
# Opt level: O2

int main(void)

{
  Builder<prometheus::Counter> *pBVar1;
  Family<prometheus::Counter> *this;
  Counter *this_00;
  long lVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator local_15a;
  allocator local_159;
  undefined1 local_158 [48];
  shared_ptr<prometheus::Registry> registry;
  string local_118;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  undefined1 local_d8 [128];
  Exposer exposer;
  
  std::__cxx11::string::string((string *)local_d8,"127.0.0.1:8080",(allocator *)local_158);
  prometheus::Exposer::Exposer(&exposer,(string *)local_d8,1,(CivetCallbacks *)0x0);
  std::__cxx11::string::~string((string *)local_d8);
  std::make_shared<prometheus::Registry>();
  prometheus::BuildCounter();
  std::__cxx11::string::string((string *)local_158,"time_running_seconds_total",&local_15a);
  pBVar1 = prometheus::detail::Builder<prometheus::Counter>::Name
                     ((Builder<prometheus::Counter> *)local_d8,(string *)local_158);
  std::__cxx11::string::string
            ((string *)&local_118,"How many seconds is this server running?",&local_159);
  pBVar1 = prometheus::detail::Builder<prometheus::Counter>::Help(pBVar1,&local_118);
  this = prometheus::detail::Builder<prometheus::Counter>::Register
                   (pBVar1,registry.
                           super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)local_158);
  prometheus::detail::Builder<prometheus::Counter>::~Builder
            ((Builder<prometheus::Counter> *)local_d8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[4],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_d8,(char (*) [14])0x12806b,(char (*) [4])"bar");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[4],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_d8 + 0x40),(char (*) [18])"yet_another_label",(char (*) [4])"baz");
  __l._M_len = 2;
  __l._M_array = (iterator)local_d8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_158,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_118,(allocator_type *)&local_15a);
  this_00 = prometheus::Family<prometheus::Counter>::Add<>(this,(Labels *)local_158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_158);
  lVar2 = 0x40;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_d8 + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  std::__weak_ptr<prometheus::Collectable,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<prometheus::Registry,void>
            ((__weak_ptr<prometheus::Collectable,(__gnu_cxx::_Lock_policy)2> *)local_158,
             &registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)local_d8,"/metrics",(allocator *)&local_118);
  prometheus::Exposer::RegisterCollectable
            (&exposer,(weak_ptr<prometheus::Collectable> *)local_158,(string *)local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/sample_server_auth.cc:34:7)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/sample_server_auth.cc:34:7)>
             ::_M_manager;
  std::__cxx11::string::string((string *)local_d8,"Some Auth Realm",(allocator *)&local_118);
  std::__cxx11::string::string((string *)local_158,"/metrics",&local_15a);
  prometheus::Exposer::RegisterAuth
            (&exposer,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_f8,(string *)local_d8,(string *)local_158);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  do {
    local_d8._0_8_ = (pointer)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)local_d8);
    prometheus::Counter::Increment(this_00,1.0);
  } while( true );
}

Assistant:

int main() {
  using namespace prometheus;

  // create an http server running on port 8080
  Exposer exposer{"127.0.0.1:8080", 1};

  auto registry = std::make_shared<Registry>();

  // add a new counter family to the registry (families combine values with the
  // same name, but distinct label dimensions)
  auto& counter_family = BuildCounter()
                             .Name("time_running_seconds_total")
                             .Help("How many seconds is this server running?")
                             .Register(*registry);

  // add a counter to the metric family
  auto& seconds_counter = counter_family.Add(
      {{"another_label", "bar"}, {"yet_another_label", "baz"}});

  // ask the exposer to scrape registry on incoming scrapes for "/metrics"
  exposer.RegisterCollectable(registry, "/metrics");
  exposer.RegisterAuth(
      [](const std::string& user, const std::string& password) {
        return user == "test_user" && password == "test_password";
      },
      "Some Auth Realm");

  for (;;) {
    std::this_thread::sleep_for(std::chrono::seconds(1));
    // increment the counters by one (second)
    seconds_counter.Increment(1.0);
  }
  return 0;
}